

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

MemOp gen_pop_T0(DisasContext *s)

{
  int iVar1;
  MemOp MVar2;
  TCGv_i64 addr;
  TCGv_i64 val;
  TCGContext *s_00;
  TCGArg a2;
  TCGTemp *ts;
  MemOp MVar3;
  
  iVar1 = s->code64;
  MVar3 = MO_64;
  if (iVar1 == 0) {
    MVar3 = MO_32 - (s->ss32 == 0);
  }
  MVar2 = s->dflag;
  gen_lea_v_seg(s,MVar3,s->uc->tcg_ctx->cpu_regs[4],2,-1);
  addr = s->A0;
  val = s->T0;
  s_00 = s->uc->tcg_ctx;
  if (s->uc->hook[10].head != (list_item *)0x0) {
    a2 = s->prev_pc;
    ts = tcg_temp_new_internal_x86_64(s_00,TCG_TYPE_I64,false);
    tcg_gen_op2_x86_64(s_00,INDEX_op_movi_i64,(TCGArg)ts,a2);
    tcg_gen_op3_x86_64(s_00,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),0x80);
    tcg_temp_free_internal_x86_64(s_00,ts);
  }
  MVar3 = (MVar2 != MO_16) + 1 + (uint)(MVar2 != MO_16);
  if (iVar1 == 0) {
    MVar3 = MVar2;
  }
  tcg_gen_qemu_ld_i64_x86_64(s_00,val,addr,(long)s->mem_index,MVar3);
  return MVar3;
}

Assistant:

static MemOp gen_pop_T0(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    MemOp d_ot = mo_pushpop(s, s->dflag);

    gen_lea_v_seg(s, mo_stacksize(s), tcg_ctx->cpu_regs[R_ESP], R_SS, -1);
    gen_op_ld_v(s, d_ot, s->T0, s->A0);

    return d_ot;
}